

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPT.cpp
# Opt level: O0

void __thiscall OpenMD::NPT::moveB(NPT *this)

{
  _Base_ptr p_Var1;
  StuntDouble **ppSVar2;
  bool bVar3;
  StuntDouble *this_00;
  ulong uVar4;
  iterator *in_RDI;
  pair<double,_double> pVar5;
  int k;
  RealType prevChi;
  RealType oldChi;
  RealType mass;
  Vector3d frc;
  Vector3d vel;
  Vector3d sc;
  Vector3d ji;
  Vector3d Tb;
  int index;
  StuntDouble *sd;
  Molecule *mol;
  IntegrableObjectIterator j;
  MoleculeIterator i;
  StuntDouble *in_stack_fffffffffffffdc8;
  Snapshot *in_stack_fffffffffffffdd0;
  StuntDouble *in_stack_fffffffffffffdd8;
  SimInfo *in_stack_fffffffffffffdf0;
  Rattle *in_stack_fffffffffffffe50;
  StuntDouble *in_stack_fffffffffffffe58;
  Thermo *in_stack_fffffffffffffea0;
  int local_104;
  pair<double,_double> local_c0;
  RealType local_b0;
  undefined1 local_78 [76];
  int local_2c;
  StuntDouble *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_18);
  Vector3<double>::Vector3((Vector3<double> *)0x215873);
  Vector3<double>::Vector3((Vector3<double> *)0x215880);
  Vector3<double>::Vector3((Vector3<double> *)0x21588d);
  Vector3<double>::Vector3((Vector3<double> *)0x21589a);
  Vector3<double>::Vector3((Vector3<double> *)0x2158a7);
  pVar5 = Snapshot::getThermostat((Snapshot *)in_RDI[0x1c]._M_current);
  local_c0.second = pVar5.second;
  local_c0.first = pVar5.first;
  std::pair<double,_double>::operator=((pair<double,_double> *)(in_RDI + 0x34),&local_c0);
  p_Var1 = (_Base_ptr)in_RDI[0x34]._M_current;
  (**(code **)((_Base_ptr)in_RDI->_M_current + 6))();
  local_2c = 0;
  local_20 = SimInfo::beginMolecule(in_stack_fffffffffffffdf0,(MoleculeIterator *)in_RDI);
  while (local_20 != (Molecule *)0x0) {
    local_28 = Molecule::beginIntegrableObject((Molecule *)in_stack_fffffffffffffdf0,in_RDI);
    while (local_28 != (StuntDouble *)0x0) {
      StuntDouble::getVel(in_stack_fffffffffffffdd8);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 (in_RDI + 0x2d),(long)local_2c);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffdd0,
                 (Vector3<double> *)in_stack_fffffffffffffdc8);
      bVar3 = StuntDouble::isDirectional((StuntDouble *)in_stack_fffffffffffffdd0);
      if (bVar3) {
        StuntDouble::getJ(in_stack_fffffffffffffdd8);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   (in_RDI + 0x30),(long)local_2c);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffdd0,
                   (Vector3<double> *)in_stack_fffffffffffffdc8);
      }
      local_2c = local_2c + 1;
      local_28 = Molecule::nextIntegrableObject((Molecule *)in_stack_fffffffffffffdf0,in_RDI);
    }
    local_20 = SimInfo::nextMolecule(in_stack_fffffffffffffdf0,(MoleculeIterator *)in_RDI);
  }
  ppSVar2 = (StuntDouble **)Thermo::getVolume((Thermo *)in_stack_fffffffffffffdd0);
  in_RDI[0x25]._M_current = ppSVar2;
  for (local_104 = 0; local_104 < *(int *)&in_RDI[0x40]._M_current; local_104 = local_104 + 1) {
    ppSVar2 = (StuntDouble **)Thermo::getTemperature((Thermo *)in_stack_fffffffffffffdf0);
    in_RDI[0x23]._M_current = ppSVar2;
    ppSVar2 = (StuntDouble **)Thermo::getPressure(in_stack_fffffffffffffea0);
    in_RDI[0x24]._M_current = ppSVar2;
    ppSVar2 = in_RDI[0x34]._M_current;
    in_RDI[0x34]._M_current =
         (StuntDouble **)
         ((double)p_Var1 +
         ((double)in_RDI[2]._M_current *
         ((double)in_RDI[0x23]._M_current / (double)in_RDI[0x26]._M_current - 1.0)) /
         (double)in_RDI[0x21]._M_current);
    (*(code *)in_RDI->_M_current[0x16])();
    (*(code *)in_RDI->_M_current[0x13])();
    local_2c = 0;
    local_20 = SimInfo::beginMolecule(in_stack_fffffffffffffdf0,(MoleculeIterator *)in_RDI);
    while (local_20 != (Molecule *)0x0) {
      local_28 = Molecule::beginIntegrableObject((Molecule *)in_stack_fffffffffffffdf0,in_RDI);
      while (local_28 != (StuntDouble *)0x0) {
        StuntDouble::getFrc(in_stack_fffffffffffffdd8);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffdd0,
                   (Vector3<double> *)in_stack_fffffffffffffdc8);
        local_b0 = StuntDouble::getMass(local_28);
        (*(code *)in_RDI->_M_current[0x11])(in_RDI,local_78,local_2c);
        this_00 = (StuntDouble *)
                  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                  operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              *)(in_RDI + 0x2d),(long)local_2c);
        OpenMD::operator*((double)in_stack_fffffffffffffdd8,
                          (Vector<double,_3U> *)in_stack_fffffffffffffdd0);
        OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffffdd8,
                          (Vector<double,_3U> *)in_stack_fffffffffffffdd0);
        OpenMD::operator*((double)in_stack_fffffffffffffdd8,
                          (Vector<double,_3U> *)in_stack_fffffffffffffdd0);
        OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffdd8,
                          (Vector<double,_3U> *)in_stack_fffffffffffffdd0);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffdd8,
                   (Vector<double,_3U> *)in_stack_fffffffffffffdd0);
        StuntDouble::setVel(this_00,(Vector3d *)in_stack_fffffffffffffdd8);
        bVar3 = StuntDouble::isDirectional((StuntDouble *)in_stack_fffffffffffffdd0);
        if (bVar3) {
          in_stack_fffffffffffffdc8 = local_28;
          StuntDouble::getTrq(in_stack_fffffffffffffdd8);
          StuntDouble::lab2Body(in_stack_fffffffffffffe58,(Vector3d *)in_stack_fffffffffffffe50);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffdd0,
                     (Vector3<double> *)in_stack_fffffffffffffdc8);
          in_stack_fffffffffffffdd0 =
               (Snapshot *)
               std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
               operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           *)(in_RDI + 0x30),(long)local_2c);
          OpenMD::operator*((double)in_stack_fffffffffffffdd8,
                            (Vector<double,_3U> *)in_stack_fffffffffffffdd0);
          OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffffdd8,
                            (Vector<double,_3U> *)in_stack_fffffffffffffdd0);
          in_stack_fffffffffffffdd8 =
               (StuntDouble *)((double)in_RDI[2]._M_current * (double)in_RDI[0x34]._M_current);
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
          operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     (in_RDI + 0x30),(long)local_2c);
          OpenMD::operator*((double)in_stack_fffffffffffffdd8,
                            (Vector<double,_3U> *)in_stack_fffffffffffffdd0);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffdd8,
                            (Vector<double,_3U> *)in_stack_fffffffffffffdd0);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffdd8,
                     (Vector<double,_3U> *)in_stack_fffffffffffffdd0);
          StuntDouble::setJ(this_00,(Vector3d *)in_stack_fffffffffffffdd8);
        }
        local_2c = local_2c + 1;
        local_28 = Molecule::nextIntegrableObject((Molecule *)in_stack_fffffffffffffdf0,in_RDI);
      }
      local_20 = SimInfo::nextMolecule(in_stack_fffffffffffffdf0,(MoleculeIterator *)in_RDI);
    }
    Rattle::constraintB(in_stack_fffffffffffffe50);
    if ((ABS((double)ppSVar2 - (double)in_RDI[0x34]._M_current) <= (double)in_RDI[0x3f]._M_current)
       && (uVar4 = (*(code *)in_RDI->_M_current[0x14])(), (uVar4 & 1) != 0)) break;
  }
  in_RDI[0x35]._M_current =
       (StuntDouble **)
       ((double)in_RDI[2]._M_current * (double)in_RDI[0x34]._M_current +
       (double)in_RDI[0x35]._M_current);
  Snapshot::setThermostat
            (in_stack_fffffffffffffdd0,(pair<double,_double> *)in_stack_fffffffffffffdc8);
  (**(code **)&(*in_RDI[0x12]._M_current)->localIndex_)();
  (*(code *)in_RDI->_M_current[0x19])();
  return;
}

Assistant:

void NPT::moveB(void) {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    int index;
    Vector3d Tb;
    Vector3d ji;
    Vector3d sc;
    Vector3d vel;
    Vector3d frc;
    RealType mass;

    thermostat      = snap->getThermostat();
    RealType oldChi = thermostat.first;
    RealType prevChi;

    loadEta();

    // save velocity and angular momentum
    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldVel[index] = sd->getVel();

        if (sd->isDirectional()) oldJi[index] = sd->getJ();

        ++index;
      }
    }

    // do the iteration:
    instaVol = thermo.getVolume();

    for (int k = 0; k < maxIterNum_; k++) {
      instaTemp  = thermo.getTemperature();
      instaPress = thermo.getPressure();

      // evolve chi another half step using the temperature at t + dt/2
      prevChi          = thermostat.first;
      thermostat.first = oldChi + dt2 * (instaTemp / targetTemp - 1.0) / tt2;

      // evolve eta
      this->evolveEtaB();
      this->calcVelScale();

      index = 0;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          frc  = sd->getFrc();
          mass = sd->getMass();

          getVelScaleB(sc, index);

          // velocity half step
          vel = oldVel[index] + dt2 * Constants::energyConvert / mass * frc -
                dt2 * sc;

          sd->setVel(vel);

          if (sd->isDirectional()) {
            // get and convert the torque to body frame
            Tb = sd->lab2Body(sd->getTrq());

            ji = oldJi[index] + dt2 * Constants::energyConvert * Tb -
                 dt2 * thermostat.first * oldJi[index];

            sd->setJ(ji);
          }

          ++index;
        }
      }

      rattle_->constraintB();

      if ((fabs(prevChi - thermostat.first) <= chiTolerance) &&
          this->etaConverged())
        break;
    }

    // calculate integral of chidt
    thermostat.second += dt2 * thermostat.first;

    snap->setThermostat(thermostat);

    flucQ_->moveB();
    saveEta();
  }